

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

void __thiscall CPlayer::Respawn(CPlayer *this)

{
  if ((this->m_Team != -1 & this->m_RespawnDisabled) == 1) {
    this->m_DeadSpecMode = true;
    this->m_IsReadyToPlay = true;
    this->m_SpecMode = 1;
    UpdateDeadSpecMode(this);
    return;
  }
  this->m_DeadSpecMode = false;
  if (this->m_Team != -1) {
    this->m_Spawning = true;
  }
  return;
}

Assistant:

void CPlayer::Respawn()
{
	if(m_RespawnDisabled && m_Team != TEAM_SPECTATORS)
	{
		// enable spectate mode for dead players
		m_DeadSpecMode = true;
		m_IsReadyToPlay = true;
		m_SpecMode = SPEC_PLAYER;
		UpdateDeadSpecMode();
		return;
	}

	m_DeadSpecMode = false;

	if(m_Team != TEAM_SPECTATORS)
		m_Spawning = true;
}